

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  long lVar2;
  long *plVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i *palVar12;
  bool bVar13;
  int iVar14;
  ulong uVar15;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar16;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *ptr;
  void *pvVar17;
  long lVar18;
  uint uVar19;
  __m128i *palVar20;
  long lVar21;
  long lVar22;
  longlong lVar23;
  int iVar24;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long lVar25;
  bool bVar26;
  __m128i *palVar27;
  long lVar28;
  ulong uVar29;
  __m128i *palVar30;
  __m128i *palVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  longlong lVar42;
  __m128i *palVar43;
  __m128i *ptr_00;
  ulong size;
  __m128i *ptr_01;
  __m128i *palVar44;
  __m128i *ptr_02;
  ulong uVar45;
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 extraout_XMM0 [16];
  longlong lVar62;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong uVar63;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ulong uVar64;
  long lVar65;
  __m128i_64_t B_3;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  long lVar70;
  undefined1 auVar69 [16];
  __m128i_64_t B_5;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  __m128i_64_t B_11;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  __m128i_64_t B_2;
  longlong lVar79;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  __m128i_64_t B_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i_64_t A;
  undefined1 auVar90 [16];
  long lVar92;
  undefined1 auVar91 [16];
  __m128i_64_t B;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  __m128i_64_t B_4;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  int32_t column_len;
  __m128i *local_1e8;
  __m128i *local_1e0;
  __m128i *local_1d8;
  __m128i *local_1d0;
  __m128i *local_1c8;
  __m128i *local_1c0;
  undefined1 local_1b8 [16];
  long local_1a0;
  __m128i *local_190;
  undefined1 local_188 [16];
  int local_148;
  longlong local_110;
  ulong uStack_60;
  ulong uStack_50;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_table_striped_profile_sse41_128_64_cold_8();
    return (parasail_result_t *)0x0;
  }
  pvVar4 = (profile->profile64).score;
  if (pvVar4 == (void *)0x0) {
    parasail_sw_stats_table_striped_profile_sse41_128_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  ppVar5 = profile->matrix;
  if (ppVar5 == (parasail_matrix_t *)0x0) {
    parasail_sw_stats_table_striped_profile_sse41_128_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  uVar32 = profile->s1Len;
  uVar15 = (ulong)uVar32;
  if ((int)uVar32 < 1) {
    parasail_sw_stats_table_striped_profile_sse41_128_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (s2 == (char *)0x0) {
    parasail_sw_stats_table_striped_profile_sse41_128_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  uVar29 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sw_stats_table_striped_profile_sse41_128_64_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sw_stats_table_striped_profile_sse41_128_64_cold_2();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sw_stats_table_striped_profile_sse41_128_64_cold_1();
    return (parasail_result_t *)0x0;
  }
  uVar1 = uVar15 + 1;
  pvVar6 = (profile->profile64).matches;
  pvVar7 = (profile->profile64).similar;
  iVar14 = ppVar5->max;
  result = parasail_result_new_table3((uint)uVar1 & 0x7ffffffe,s2Len);
  if (result == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  size = uVar1 >> 1;
  result->flag = result->flag | 0x2830804;
  b = parasail_memalign___m128i(0x10,size);
  palVar16 = parasail_memalign___m128i(0x10,size);
  b_00 = parasail_memalign___m128i(0x10,size);
  local_1d0 = parasail_memalign___m128i(0x10,size);
  b_01 = parasail_memalign___m128i(0x10,size);
  local_1d8 = parasail_memalign___m128i(0x10,size);
  b_02 = parasail_memalign___m128i(0x10,size);
  local_1e0 = parasail_memalign___m128i(0x10,size);
  b_03 = parasail_memalign___m128i(0x10,size);
  b_04 = parasail_memalign___m128i(0x10,size);
  b_05 = parasail_memalign___m128i(0x10,size);
  b_06 = parasail_memalign___m128i(0x10,size);
  local_190 = parasail_memalign___m128i(0x10,size);
  local_1c0 = parasail_memalign___m128i(0x10,size);
  ptr = parasail_memalign___m128i(0x10,size);
  local_1c8 = parasail_memalign___m128i(0x10,size);
  auVar47._0_8_ = -(ulong)(b == (__m128i *)0x0);
  auVar47._8_8_ = -(ulong)(palVar16 == (__m128i *)0x0);
  auVar99._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
  auVar99._8_8_ = -(ulong)(local_1d0 == (__m128i *)0x0);
  auVar47 = packssdw(auVar47,auVar99);
  auVar75._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
  auVar75._8_8_ = -(ulong)(local_1d8 == (__m128i *)0x0);
  auVar78._0_8_ = -(ulong)(b_02 == (__m128i *)0x0);
  auVar78._8_8_ = -(ulong)(local_1e0 == (__m128i *)0x0);
  auVar71 = packssdw(auVar75,auVar78);
  auVar47 = packssdw(auVar47,auVar71);
  auVar71._0_8_ = -(ulong)(b_03 == (__m128i *)0x0);
  auVar71._8_8_ = -(ulong)(b_04 == (__m128i *)0x0);
  auVar87._0_8_ = -(ulong)(b_05 == (__m128i *)0x0);
  auVar87._8_8_ = -(ulong)(b_06 == (__m128i *)0x0);
  auVar71 = packssdw(auVar71,auVar87);
  auVar95._0_8_ = -(ulong)(local_190 == (__m128i *)0x0);
  auVar95._8_8_ = -(ulong)(local_1c0 == (__m128i *)0x0);
  auVar97._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
  auVar97._8_8_ = -(ulong)(local_1c8 == (__m128i *)0x0);
  auVar75 = packssdw(auVar95,auVar97);
  auVar71 = packssdw(auVar71,auVar75);
  auVar47 = packsswb(auVar47,auVar71);
  if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar47[0xf] < '\0') {
    return (parasail_result_t *)0x0;
  }
  uVar45 = (ulong)(uint)gap;
  c[1] = (longlong)b_03;
  c[0] = size;
  palVar20 = local_1c0;
  parasail_memset___m128i(b,c,(size_t)local_1c0);
  c_00[1] = extraout_RDX;
  c_00[0] = size;
  parasail_memset___m128i(b_00,c_00,(size_t)palVar20);
  c_01[1] = extraout_RDX_00;
  c_01[0] = size;
  parasail_memset___m128i(b_01,c_01,(size_t)palVar20);
  c_02[1] = extraout_RDX_01;
  c_02[0] = size;
  parasail_memset___m128i(b_02,c_02,(size_t)palVar20);
  c_03[1] = extraout_RDX_02;
  c_03[0] = size;
  parasail_memset___m128i(b_03,c_03,(size_t)palVar20);
  c_04[1] = extraout_RDX_03;
  c_04[0] = size;
  parasail_memset___m128i(b_04,c_04,(size_t)palVar20);
  c_05[1] = extraout_RDX_04;
  c_05[0] = size;
  parasail_memset___m128i(b_05,c_05,(size_t)palVar20);
  pmovsxbq(extraout_XMM0,0x101);
  c_06[1] = extraout_RDX_05;
  c_06[0] = size;
  parasail_memset___m128i(b_06,c_06,(size_t)palVar20);
  uVar38 = 0;
  uVar9 = (uint)size;
  uVar19 = uVar9 - 1;
  lVar25 = size * uVar29 * 4;
  lVar2 = uVar29 * 4;
  lVar28 = 0;
  uVar35 = 0;
  local_110 = 0;
  local_1a0 = -0x4000000000000000;
  local_1b8 = (undefined1  [16])0x0;
  auVar66 = (undefined1  [16])0x0;
  auVar47 = (undefined1  [16])0x0;
  lVar18 = lVar25;
  do {
    palVar44 = b_00;
    palVar20 = b;
    palVar43 = b_01;
    palVar30 = b_02;
    lVar21 = (long)(int)(ppVar5->mapper[(byte)s2[uVar35]] * uVar9) * 0x10;
    pvVar17 = (void *)((long)pvVar4 + lVar21);
    local_148 = (int)uVar35;
    iVar36 = (int)uVar38;
    b = palVar16;
    b_01 = local_1d8;
    palVar27 = local_1c8;
    palVar31 = local_1c0;
    b_02 = local_1e0;
    b_00 = local_1d0;
    if (iVar36 == local_148 + -2) {
      b = local_190;
      b_01 = ptr;
      local_190 = palVar16;
      ptr = local_1d8;
      palVar27 = local_1e0;
      palVar31 = local_1d0;
      b_02 = local_1c8;
      b_00 = local_1c0;
    }
    local_1c0 = palVar31;
    local_1c8 = palVar27;
    lVar23 = palVar30[uVar19][0];
    lVar34 = 0;
    lVar42 = palVar43[uVar19][0];
    lVar70 = 0;
    lVar79 = palVar44[uVar19][0];
    lVar65 = 0;
    lVar62 = palVar20[uVar19][0];
    lVar22 = 0;
    local_188 = (undefined1  [16])0x0;
    lVar33 = 0;
    auVar71 = ZEXT816(0);
    auVar80 = (undefined1  [16])0x0;
    lVar39 = lVar28;
    lVar41 = lVar18;
    auVar85 = _DAT_009050f0;
    do {
      auVar75 = *(undefined1 (*) [16])((long)*b_03 + lVar33);
      auVar88._0_8_ = lVar22 + *(long *)((long)pvVar17 + lVar33);
      auVar88._8_8_ = lVar62 + ((long *)((long)pvVar17 + lVar33))[1];
      auVar67._0_8_ = -(ulong)(0 < auVar88._0_8_);
      auVar67._8_8_ = -(ulong)(0 < auVar88._8_8_);
      auVar67 = auVar67 & auVar88;
      auVar90._0_8_ = -(ulong)(auVar75._0_8_ < auVar67._0_8_);
      auVar90._8_8_ = -(ulong)(auVar75._8_8_ < auVar67._8_8_);
      auVar99 = blendvpd(auVar75,auVar67,auVar90);
      auVar95 = *(undefined1 (*) [16])((long)*b_06 + lVar33);
      auVar72._0_8_ = -(ulong)(auVar80._0_8_ < auVar99._0_8_);
      auVar72._8_8_ = -(ulong)(auVar80._8_8_ < auVar99._8_8_);
      auVar90 = blendvpd(auVar80,auVar99,auVar72);
      auVar99 = *(undefined1 (*) [16])((long)*b_04 + lVar33);
      auVar78 = *(undefined1 (*) [16])((long)*b_05 + lVar33);
      *(undefined1 (*) [16])((long)*b + lVar33) = auVar90;
      auVar87 = blendvpd(auVar71,auVar99,auVar72);
      plVar3 = (long *)((long)pvVar6 + lVar33 + lVar21);
      auVar77._0_8_ = lVar65 + *plVar3;
      auVar77._8_8_ = lVar79 + plVar3[1];
      lVar65 = auVar90._0_8_;
      auVar68._0_8_ = -(ulong)(auVar67._0_8_ == lVar65);
      lVar92 = auVar90._8_8_;
      auVar68._8_8_ = -(ulong)(auVar67._8_8_ == lVar92);
      auVar88 = blendvpd(auVar87,auVar77,auVar68);
      auVar100._0_8_ = -(ulong)(lVar65 == 0);
      auVar100._8_8_ = -(ulong)(lVar92 == 0);
      auVar88 = ~auVar100 & auVar88;
      *(undefined1 (*) [16])((long)*b_00 + lVar33) = auVar88;
      auVar87 = blendvpd(local_188,auVar78,auVar72);
      plVar3 = (long *)((long)pvVar7 + lVar33 + lVar21);
      auVar96._0_8_ = lVar70 + *plVar3;
      auVar96._8_8_ = lVar42 + plVar3[1];
      auVar87 = blendvpd(auVar87,auVar96,auVar68);
      auVar97 = blendvpd(auVar85,auVar95,auVar72);
      auVar98._8_4_ = 0xffffffff;
      auVar98._0_8_ = 0xffffffffffffffff;
      auVar98._12_4_ = 0xffffffff;
      auVar76._0_8_ = lVar34 + 1;
      auVar76._8_8_ = lVar23 - auVar98._8_8_;
      auVar98 = blendvpd(auVar97,auVar76,auVar68);
      auVar87 = ~auVar100 & auVar87;
      *(undefined1 (*) [16])((long)*b_01 + lVar33) = auVar87;
      auVar98 = ~auVar100 & auVar98;
      *(undefined1 (*) [16])((long)*b_02 + lVar33) = auVar98;
      lVar22 = *(long *)((long)((result->field_4).trace)->trace_del_table + 8);
      *(int *)(lVar22 + lVar39) = auVar88._0_4_;
      *(int *)(lVar22 + lVar41) = auVar88._8_4_;
      lVar22 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x10);
      *(int *)(lVar22 + lVar39) = auVar87._0_4_;
      *(int *)(lVar22 + lVar41) = auVar87._8_4_;
      lVar22 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
      *(int *)(lVar22 + lVar39) = auVar98._0_4_;
      *(int *)(lVar22 + lVar41) = auVar98._8_4_;
      lVar22 = *((result->field_4).trace)->trace_del_table;
      *(int *)(lVar22 + lVar39) = auVar90._0_4_;
      *(int *)(lVar22 + lVar41) = auVar90._8_4_;
      auVar48._0_8_ = -(ulong)(auVar88._0_8_ < local_1b8._0_8_);
      auVar48._8_8_ = -(ulong)(auVar88._8_8_ < local_1b8._8_8_);
      auVar97 = blendvpd(auVar88,local_1b8,auVar48);
      auVar49._0_8_ = -(ulong)(auVar87._0_8_ < auVar97._0_8_);
      auVar49._8_8_ = -(ulong)(auVar87._8_8_ < auVar97._8_8_);
      auVar97 = blendvpd(auVar87,auVar97,auVar49);
      auVar50._0_8_ = -(ulong)(auVar98._0_8_ < auVar97._0_8_);
      auVar50._8_8_ = -(ulong)(auVar98._8_8_ < auVar97._8_8_);
      local_1b8 = blendvpd(auVar98,auVar97,auVar50);
      auVar51._0_8_ = -(ulong)(auVar47._0_8_ < lVar65);
      auVar51._8_8_ = -(ulong)(auVar47._8_8_ < lVar92);
      auVar47 = blendvpd(auVar47,auVar90,auVar51);
      uStack_50 = (ulong)(uint)open;
      auVar91._0_8_ = lVar65 - (ulong)(uint)open;
      auVar91._8_8_ = lVar92 - uStack_50;
      uStack_60 = (ulong)(uint)gap;
      auVar93._0_8_ = auVar75._0_8_ - uVar45;
      auVar93._8_8_ = auVar75._8_8_ - uStack_60;
      auVar52._0_8_ = -(ulong)(auVar93._0_8_ < auVar91._0_8_);
      auVar52._8_8_ = -(ulong)(auVar93._8_8_ < auVar91._8_8_);
      auVar97 = blendvpd(auVar93,auVar91,auVar52);
      auVar99 = blendvpd(auVar99,auVar88,auVar52);
      auVar75 = blendvpd(auVar78,auVar87,auVar52);
      auVar83._8_4_ = 0xffffffff;
      auVar83._0_8_ = 0xffffffffffffffff;
      auVar83._12_4_ = 0xffffffff;
      auVar94._0_8_ = auVar95._0_8_ + 1;
      lVar22 = auVar83._8_8_;
      auVar94._8_8_ = auVar95._8_8_ - lVar22;
      auVar101._0_8_ = auVar98._0_8_ + 1;
      auVar101._8_8_ = auVar98._8_8_ - lVar22;
      auVar95 = blendvpd(auVar94,auVar101,auVar52);
      auVar81._0_8_ = auVar80._0_8_ - uVar45;
      auVar81._8_8_ = auVar80._8_8_ - uStack_60;
      auVar53._0_8_ = -(ulong)(auVar81._0_8_ < auVar91._0_8_);
      auVar53._8_8_ = -(ulong)(auVar81._8_8_ < auVar91._8_8_);
      auVar80 = blendvpd(auVar81,auVar91,auVar53);
      auVar71 = blendvpd(auVar71,auVar88,auVar53);
      *(undefined1 (*) [16])((long)*b_03 + lVar33) = auVar97;
      *(undefined1 (*) [16])((long)*b_04 + lVar33) = auVar99;
      *(undefined1 (*) [16])((long)*b_05 + lVar33) = auVar75;
      *(undefined1 (*) [16])((long)*b_06 + lVar33) = auVar95;
      local_188 = blendvpd(local_188,auVar87,auVar53);
      auVar84._0_8_ = auVar85._0_8_ + 1;
      auVar84._8_8_ = auVar85._8_8_ - lVar22;
      auVar85 = blendvpd(auVar84,auVar101,auVar53);
      plVar3 = (long *)((long)*palVar20 + lVar33);
      lVar22 = *plVar3;
      lVar62 = plVar3[1];
      plVar3 = (long *)((long)*palVar44 + lVar33);
      lVar65 = *plVar3;
      lVar79 = plVar3[1];
      plVar3 = (long *)((long)*palVar43 + lVar33);
      lVar70 = *plVar3;
      lVar42 = plVar3[1];
      plVar3 = (long *)((long)*palVar30 + lVar33);
      lVar34 = *plVar3;
      lVar23 = plVar3[1];
      lVar33 = lVar33 + 0x10;
      lVar41 = lVar41 + lVar2;
      lVar39 = lVar39 + lVar2;
    } while (size << 4 != lVar33);
    bVar13 = true;
    do {
      bVar26 = bVar13;
      auVar86._0_8_ = auVar85._0_8_;
      auVar86._8_4_ = auVar85._0_4_;
      auVar86._12_4_ = auVar85._4_4_;
      auVar85._8_8_ = auVar86._8_8_;
      auVar85._0_8_ = 1;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_188._0_8_;
      local_188 = auVar10 << 0x40;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = auVar71._0_8_;
      auVar71 = auVar11 << 0x40;
      auVar82._0_8_ = auVar80._0_8_;
      auVar82._8_4_ = auVar80._0_4_;
      auVar82._12_4_ = auVar80._4_4_;
      auVar80._8_8_ = auVar82._8_8_;
      auVar80._0_8_ = (long)-open;
      lVar23 = palVar20[uVar19][0];
      lVar21 = 0;
      lVar34 = 0;
      lVar22 = lVar28;
      do {
        uVar46 = lVar21 + *(long *)((long)pvVar17 + lVar34);
        uVar63 = lVar23 + ((long *)((long)pvVar17 + lVar34))[1];
        auVar75 = *(undefined1 (*) [16])((long)*b + lVar34);
        auVar54._0_8_ = -(ulong)(auVar80._0_8_ < auVar75._0_8_);
        lVar39 = auVar80._8_8_;
        auVar54._8_8_ = -(ulong)(lVar39 < auVar75._8_8_);
        auVar75 = blendvpd(auVar80,auVar75,auVar54);
        *(undefined1 (*) [16])((long)*b + lVar34) = auVar75;
        uVar64 = auVar75._0_8_;
        auVar73._0_8_ = -(ulong)((-(ulong)(0 < (long)uVar46) & uVar46) == uVar64);
        uVar46 = auVar75._8_8_;
        auVar73._8_8_ = -(ulong)((-(ulong)(0 < (long)uVar63) & uVar63) == uVar46);
        auVar73 = auVar73 | auVar54;
        auVar99 = blendvpd(auVar71,*(undefined1 (*) [16])((long)*b_00 + lVar34),auVar73);
        *(undefined1 (*) [16])((long)*b_00 + lVar34) = auVar99;
        auVar78 = blendvpd(local_188,*(undefined1 (*) [16])((long)*b_01 + lVar34),auVar73);
        *(undefined1 (*) [16])((long)*b_01 + lVar34) = auVar78;
        auVar87 = blendvpd(auVar85,*(undefined1 (*) [16])((long)*b_02 + lVar34),auVar73);
        *(undefined1 (*) [16])((long)*b_02 + lVar34) = auVar87;
        auVar55._0_8_ = -(ulong)(auVar99._0_8_ < local_1b8._0_8_);
        auVar55._8_8_ = -(ulong)(auVar99._8_8_ < local_1b8._8_8_);
        auVar95 = blendvpd(auVar99,local_1b8,auVar55);
        lVar21 = *(long *)((long)((result->field_4).trace)->trace_del_table + 8);
        *(int *)(lVar21 + lVar22) = auVar99._0_4_;
        *(int *)(lVar25 + lVar21 + lVar22) = auVar99._8_4_;
        auVar56._0_8_ = -(ulong)(auVar78._0_8_ < auVar95._0_8_);
        auVar56._8_8_ = -(ulong)(auVar78._8_8_ < auVar95._8_8_);
        lVar21 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x10);
        *(int *)(lVar21 + lVar22) = auVar78._0_4_;
        *(int *)(lVar25 + lVar21 + lVar22) = auVar78._8_4_;
        auVar95 = blendvpd(auVar78,auVar95,auVar56);
        lVar21 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
        *(int *)(lVar21 + lVar22) = auVar87._0_4_;
        uVar8 = extractps(auVar87,2);
        *(undefined8 *)(lVar25 + lVar21 + lVar22) = uVar8;
        auVar57._0_8_ = -(ulong)(auVar87._0_8_ < auVar95._0_8_);
        auVar57._8_8_ = -(ulong)(auVar87._8_8_ < auVar95._8_8_);
        lVar21 = *((result->field_4).trace)->trace_del_table;
        *(int *)(lVar21 + lVar22) = auVar75._0_4_;
        lVar21 = lVar21 + lVar22;
        *(int *)(lVar25 + lVar21) = auVar75._8_4_;
        local_1b8 = blendvpd(auVar87,auVar95,auVar57);
        auVar58._0_8_ = -(ulong)(auVar47._0_8_ < (long)uVar64);
        auVar58._8_8_ = -(ulong)(auVar47._8_8_ < (long)uVar46);
        auVar47 = blendvpd(auVar47,auVar75,auVar58);
        lVar65 = uVar64 - (uint)open;
        lVar70 = uVar46 - uStack_50;
        auVar80._0_8_ = auVar80._0_8_ - uVar45;
        auVar80._8_8_ = lVar39 - uStack_60;
        auVar59._0_8_ = -(ulong)(lVar65 < auVar80._0_8_);
        auVar59._8_8_ = -(ulong)(lVar70 < auVar80._8_8_);
        auVar74._0_8_ = -(ulong)(auVar80._0_8_ == lVar65);
        auVar74._8_8_ = -(ulong)(auVar80._8_8_ == lVar70);
        auVar89._0_8_ = -(ulong)(0 < auVar80._0_8_);
        auVar89._8_8_ = -(ulong)(0 < auVar80._8_8_);
        iVar37 = movmskpd((int)lVar21,auVar89 & auVar74 | auVar59);
        if (iVar37 == 0) goto LAB_006ef2c2;
        auVar69._0_8_ = -(ulong)(auVar80._0_8_ < lVar65);
        auVar69._8_8_ = -(ulong)(auVar80._8_8_ < lVar70);
        auVar71 = blendvpd(auVar71,auVar99,auVar69);
        local_188 = blendvpd(local_188,auVar78,auVar69);
        auVar75 = blendvpd(auVar85,auVar87,auVar69);
        auVar85._0_8_ = auVar75._0_8_ + 1;
        auVar85._8_8_ = auVar75._8_8_ + 1;
        plVar3 = (long *)((long)*palVar20 + lVar34);
        lVar21 = *plVar3;
        lVar23 = plVar3[1];
        lVar34 = lVar34 + 0x10;
        lVar22 = lVar22 + lVar2;
      } while (size << 4 != lVar34);
      bVar13 = false;
    } while (bVar26);
LAB_006ef2c2:
    lVar21 = auVar47._0_8_;
    lVar22 = auVar47._8_8_;
    auVar60._0_8_ = -(ulong)(auVar66._0_8_ < lVar21);
    auVar60._8_8_ = -(ulong)(auVar66._8_8_ < lVar22);
    iVar37 = movmskpd((int)pvVar17,auVar60);
    local_1d8 = palVar43;
    local_1e0 = palVar30;
    local_1d0 = palVar44;
    if (iVar37 != 0) {
      local_1a0 = lVar22;
      if (lVar22 < lVar21) {
        local_1a0 = lVar21;
      }
      if ((long)(~(long)iVar14 + 0x7fffffffffffffffU) < local_1a0) {
        *(byte *)&result->flag = (byte)result->flag | 0x40;
        break;
      }
      auVar66._8_4_ = (int)local_1a0;
      auVar66._0_8_ = local_1a0;
      auVar66._12_4_ = (int)((ulong)local_1a0 >> 0x20);
      uVar38 = uVar35 & 0xffffffff;
    }
    iVar36 = (int)uVar38;
    uVar35 = uVar35 + 1;
    lVar18 = lVar18 + 4;
    lVar28 = lVar28 + 4;
    palVar16 = palVar20;
    local_148 = s2Len;
  } while (uVar35 != uVar29);
  if (local_1a0 != 0x7fffffffffffffff) {
    auVar61._0_8_ = -(ulong)(local_1b8._0_8_ == 0x7fffffffffffffff);
    auVar61._8_8_ = -(ulong)(local_1b8._8_8_ == 0x7fffffffffffffff);
    iVar14 = movmskpd(0xffffffff,auVar61);
    if (iVar14 == 0) goto LAB_006ef3a5;
  }
  *(byte *)&result->flag = (byte)result->flag | 0x40;
LAB_006ef3a5:
  iVar14 = parasail_result_is_saturated(result);
  iVar37 = 0;
  if (iVar14 == 0) {
    palVar27 = b_00;
    palVar31 = b_02;
    palVar12 = b_01;
    palVar16 = b;
    ptr_00 = ptr;
    ptr_01 = local_190;
    ptr_02 = local_1c0;
    local_1e8 = local_1c8;
    if ((iVar36 != local_148 + -1) &&
       (palVar27 = local_1c0, palVar31 = local_1c8, palVar12 = ptr, palVar16 = local_190,
       ptr_00 = b_01, ptr_01 = b, ptr_02 = b_00, local_1e8 = b_02, iVar36 == local_148 + -2)) {
      local_1d8 = ptr;
      local_1e0 = local_1c8;
      palVar27 = palVar44;
      palVar31 = palVar30;
      palVar12 = palVar43;
      palVar16 = palVar20;
      palVar20 = local_190;
      local_1d0 = local_1c0;
    }
    ptr = palVar12;
    if ((uVar1 & 0x7ffffffe) == 0) {
      iVar37 = 0;
      iVar40 = 0;
      iVar14 = 0;
    }
    else {
      uVar29 = 0;
      lVar23 = 0;
      lVar42 = 0;
      do {
        if ((*palVar16)[uVar29] == local_1a0) {
          uVar32 = 0;
          if ((uVar29 & 1) != 0) {
            uVar32 = uVar9;
          }
          uVar32 = uVar32 + ((uint)(uVar29 >> 1) & 0x7fffffff);
          if ((int)uVar32 < (int)uVar15) {
            local_110 = (*palVar27)[uVar29];
            lVar23 = (*ptr)[uVar29];
            lVar42 = (*palVar31)[uVar29];
            uVar15 = (ulong)uVar32;
          }
        }
        iVar40 = (int)lVar42;
        iVar37 = (int)lVar23;
        uVar32 = (uint)uVar15;
        uVar29 = uVar29 + 1;
      } while ((uVar9 & 0x3fffffff) * 2 != (int)uVar29);
      iVar14 = (int)local_110;
    }
    iVar24 = (int)local_1a0;
  }
  else {
    iVar40 = 0;
    iVar14 = 0;
    iVar24 = 0;
    iVar36 = 0;
    uVar32 = 0;
    palVar31 = local_1c8;
    ptr_00 = b_01;
    ptr_01 = b;
    ptr_02 = b_00;
    local_1e8 = b_02;
    palVar16 = local_190;
    palVar27 = local_1c0;
  }
  result->score = iVar24;
  result->end_query = uVar32;
  result->end_ref = iVar36;
  ((result->field_4).stats)->matches = iVar14;
  ((result->field_4).stats)->similar = iVar37;
  ((result->field_4).stats)->length = iVar40;
  parasail_free(palVar31);
  parasail_free(ptr);
  parasail_free(palVar27);
  parasail_free(palVar16);
  parasail_free(b_06);
  parasail_free(b_05);
  parasail_free(b_04);
  parasail_free(b_03);
  parasail_free(local_1e0);
  parasail_free(local_1e8);
  parasail_free(local_1d8);
  parasail_free(ptr_00);
  parasail_free(local_1d0);
  parasail_free(ptr_02);
  parasail_free(palVar20);
  parasail_free(ptr_01);
  return result;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vSaturationCheckMax;
    __m128i vPosLimit;
    int64_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm_set1_epi64x_rpl(INT64_MAX);
    maxp = INT64_MAX - (int64_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    pvHMax    = parasail_memalign___m128i(16, segLen);
    pvHMMax   = parasail_memalign___m128i(16, segLen);
    pvHSMax   = parasail_memalign___m128i(16, segLen);
    pvHLMax   = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i cond_zero;
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi64_rpl(vH_dag, vZero);
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            cond_zero = _mm_cmpeq_epi64(vH, vZero);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)), case1);
            vHM = _mm_andnot_si128(cond_zero, vHM);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)), case1);
            vHS = _mm_andnot_si128(cond_zero, vHS);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne), case1);
            vHL = _mm_andnot_si128(cond_zero, vHL);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, -open, 0);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vHp = _mm_max_epi64_rpl(vHp, vZero);
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_and_si128(
                                    _mm_cmpeq_epi64(vF_ext, vEF_opn),
                                    _mm_cmpgt_epi64_rpl(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT64_MAX
            || _mm_movemask_epi8(_mm_cmpeq_epi64(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int64_t *m = (int64_t*)pvHMMax;
            int64_t *s = (int64_t*)pvHSMax;
            int64_t *l = (int64_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}